

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

bool __thiscall cppurses::Event::send_to_all_filters(Event *this)

{
  Widget *this_00;
  bool bVar1;
  uint uVar2;
  set<cppurses::Widget_*,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
  *this_01;
  reference ppWVar3;
  Widget *filter;
  iterator __end1;
  iterator __begin1;
  set<cppurses::Widget_*,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
  *__range1;
  set<cppurses::Widget_*,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
  *filters;
  Event *this_local;
  
  this_01 = Widget::get_event_filters(this->receiver_);
  __end1 = std::
           set<cppurses::Widget_*,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
           ::begin(this_01);
  filter = (Widget *)
           std::
           set<cppurses::Widget_*,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
           ::end(this_01);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&filter);
    if (!bVar1) {
      return false;
    }
    ppWVar3 = std::_Rb_tree_const_iterator<cppurses::Widget_*>::operator*(&__end1);
    this_00 = *ppWVar3;
    bVar1 = Widget::enabled(this_00);
    if ((bVar1) && (uVar2 = (*this->_vptr_Event[3])(this,this_00), (uVar2 & 1) != 0)) break;
    std::_Rb_tree_const_iterator<cppurses::Widget_*>::operator++(&__end1);
  }
  return true;
}

Assistant:

auto Event::send_to_all_filters() const -> bool
{
    auto const& filters = receiver_.get_event_filters();
    for (Widget* filter : filters) {
        if (filter->enabled() && this->filter_send(*filter))
            return true;
    }
    return false;
}